

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

void __thiscall
chrono::ChDirectSolverLS::WriteVector
          (ChDirectSolverLS *this,string *filename,ChVectorDynamic<double> *v)

{
  CoeffReturnType pdVar1;
  ChStreamOutAscii *this_00;
  int i;
  long index;
  ChStreamOutAsciiFile file;
  
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file,(filename->_M_dataplus)._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file.super_ChStreamOutAscii,"%.12g");
  for (index = 0;
      index < (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      index = index + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)v,index);
    this_00 = ChStreamOutAscii::operator<<(&file.super_ChStreamOutAscii,*pdVar1);
    ChStreamOutAscii::operator<<(this_00,"\n");
  }
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file);
  return;
}

Assistant:

void ChDirectSolverLS::WriteVector(const std::string& filename, const ChVectorDynamic<double>& v) {
    ChStreamOutAsciiFile file(filename.c_str());
    file.SetNumFormat("%.12g");
    for (int i = 0; i < v.size(); i++)
        file << v(i) << "\n";
}